

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000144610 = 0x2d2d2d2d2d2d2d;
    uRam0000000000144617 = 0x2d2d2d2d2d2d2d2d;
    _DAT_00144600 = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000144608 = 0x2d2d2d2d2d2d2d;
    DAT_0014460f = 0x2d;
    _DAT_001445f0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001445f8 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001445e0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001445e8 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001445d8 = 0x2d2d2d2d2d2d2d2d;
    DAT_0014461f = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,"\n");
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void printOpenHeader( std::string const& _name ) {
            stream  << getLineOfChars<'-'>() << "\n";
            {
                Colour colourGuard( Colour::Headers );
                printHeaderString( _name );
            }
        }